

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int split_init(saucy *s,coloring *c,int cf,int ff)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  
  s->splitwho[s->nsplits] = ff;
  s->splitfrom[s->nsplits] = cf;
  s->nsplits = s->nsplits + 1;
  split_common(s,c,cf,ff);
  piVar1 = c->clen;
  if (piVar1[ff] != 0) {
    piVar2 = s->nextnon;
    piVar3 = s->prevnon;
    piVar3[piVar2[cf]] = ff;
    piVar2[ff] = piVar2[cf];
    piVar3[ff] = cf;
    piVar2[cf] = ff;
  }
  if (piVar1[cf] == 0) {
    piVar1 = s->nextnon;
    piVar2 = s->prevnon;
    piVar1[piVar2[cf]] = piVar1[cf];
    piVar2[piVar1[cf]] = piVar2[cf];
  }
  return 1;
}

Assistant:

static int
split_init(struct saucy *s, struct coloring *c, int cf, int ff)
{
    split_left(s, c, cf, ff);

    /* Maintain nonsingleton list for finding new targets */
    if (c->clen[ff]) {
        s->prevnon[s->nextnon[cf]] = ff;
        s->nextnon[ff] = s->nextnon[cf];
        s->prevnon[ff] = cf;
        s->nextnon[cf] = ff;
    }
    if (!c->clen[cf]) {
        s->nextnon[s->prevnon[cf]] = s->nextnon[cf];
        s->prevnon[s->nextnon[cf]] = s->prevnon[cf];
    }

    /* Always succeeds */
    return 1;
}